

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_chunk_test.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CollectFieldsTest_AllDifferentChunks_Test::
~CollectFieldsTest_AllDifferentChunks_Test(CollectFieldsTest_AllDifferentChunks_Test *this)

{
  CollectFieldsTest_AllDifferentChunks_Test *this_local;
  
  ~CollectFieldsTest_AllDifferentChunks_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CollectFieldsTest, AllDifferentChunks) {
  const char* field_names[] = {"repeated_int32", "optional_int32",
                               "optional_int64"};

  auto chunks = CreateAndCollectFields<TestAllTypes>(
      field_names, [](const FieldDescriptor* lhs, const FieldDescriptor* rhs) {
        return false;
      });

  EXPECT_EQ(chunks.size(), 3);
}